

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Xform> *a)

{
  int iVar1;
  bool bVar2;
  ON__INT32 i_00;
  long lVar3;
  int i;
  ulong uVar4;
  
  iVar1 = a->m_count;
  i_00 = 0;
  if (0 < iVar1) {
    i_00 = iVar1;
  }
  bVar2 = WriteInt(this,i_00);
  if (bVar2 && 0 < (long)iVar1) {
    bVar2 = true;
    lVar3 = 0;
    for (uVar4 = 0; (bVar2 != false && (uVar4 < (ulong)(long)iVar1)); uVar4 = uVar4 + 1) {
      bVar2 = WriteXform(this,(ON_Xform *)((long)a->m_a->m_xform[0] + lVar3));
      lVar3 = lVar3 + 0x80;
    }
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_Xform>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) 
  {
    int i;
    for ( i = 0; i < count && rc; i++ )
      rc = WriteXform(a[i]);
  }
  return rc;
}